

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall wallet::CWallet::BlockUntilSyncedToCurrentChain(CWallet *this)

{
  Chain *pCVar1;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  uint256 last_block_hash;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  CWallet *this_00;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  AssertLockNotHeldInline
            ((char *)in_RDI,(char *)&in_RDI->cs_wallet,in_stack_ffffffffffffffac,
             (RecursiveMutex *)0x1704999);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  BlockUntilSyncedToCurrentChain::anon_class_8_1_8991fb9c::operator()
            ((anon_class_8_1_8991fb9c *)this_00);
  pCVar1 = chain(in_RDI);
  (*pCVar1->_vptr_Chain[0x2a])(pCVar1,local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::BlockUntilSyncedToCurrentChain() const {
    AssertLockNotHeld(cs_wallet);
    // Skip the queue-draining stuff if we know we're caught up with
    // chain().Tip(), otherwise put a callback in the validation interface queue and wait
    // for the queue to drain enough to execute it (indicating we are caught up
    // at least with the time we entered this function).
    uint256 last_block_hash = WITH_LOCK(cs_wallet, return m_last_block_processed);
    chain().waitForNotificationsIfTipChanged(last_block_hash);
}